

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O1

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  string *psVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  long *plVar12;
  ostream *poVar13;
  ostream *poVar14;
  char **ppcVar15;
  double dVar16;
  Real RVar17;
  string reason;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  cpp_dec_float<100U,_int,_void> local_788;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_738;
  undefined1 local_6e8 [16];
  char *local_6d8;
  long lStack_6d0;
  uint local_6c8 [7];
  undefined3 uStack_6ab;
  undefined5 uStack_6a8;
  undefined8 local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"");
  local_738.m_backend.fpclass = cpp_dec_float_finite;
  local_738.m_backend.prec_elem = 0x10;
  local_738.m_backend.data._M_elems[0] = 0;
  local_738.m_backend.data._M_elems[1] = 0;
  local_738.m_backend.data._M_elems[2] = 0;
  local_738.m_backend.data._M_elems[3] = 0;
  local_738.m_backend.data._M_elems[4] = 0;
  local_738.m_backend.data._M_elems[5] = 0;
  local_738.m_backend.data._M_elems[6] = 0;
  local_738.m_backend.data._M_elems[7] = 0;
  local_738.m_backend.data._M_elems[8] = 0;
  local_738.m_backend.data._M_elems[9] = 0;
  local_738.m_backend.data._M_elems[10] = 0;
  local_738.m_backend.data._M_elems[0xb] = 0;
  local_738.m_backend.data._M_elems[0xc] = 0;
  local_738.m_backend.data._M_elems[0xd] = 0;
  local_738.m_backend.data._M_elems._56_5_ = 0;
  local_738.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_738.m_backend.exp = 0;
  local_738.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_738,0.0);
  local_538.m_backend.fpclass = cpp_dec_float_finite;
  local_538.m_backend.prec_elem = 0x10;
  local_538.m_backend.data._M_elems[0] = 0;
  local_538.m_backend.data._M_elems[1] = 0;
  local_538.m_backend.data._M_elems[2] = 0;
  local_538.m_backend.data._M_elems[3] = 0;
  local_538.m_backend.data._M_elems[4] = 0;
  local_538.m_backend.data._M_elems[5] = 0;
  local_538.m_backend.data._M_elems[6] = 0;
  local_538.m_backend.data._M_elems[7] = 0;
  local_538.m_backend.data._M_elems[8] = 0;
  local_538.m_backend.data._M_elems[9] = 0;
  local_538.m_backend.data._M_elems[10] = 0;
  local_538.m_backend.data._M_elems[0xb] = 0;
  local_538.m_backend.data._M_elems[0xc] = 0;
  local_538.m_backend.data._M_elems[0xd] = 0;
  local_538.m_backend.data._M_elems._56_5_ = 0;
  local_538.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_538.m_backend.exp = 0;
  local_538.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_538,0.0);
  local_588.m_backend.fpclass = cpp_dec_float_finite;
  local_588.m_backend.prec_elem = 0x10;
  local_588.m_backend.data._M_elems[0] = 0;
  local_588.m_backend.data._M_elems[1] = 0;
  local_588.m_backend.data._M_elems[2] = 0;
  local_588.m_backend.data._M_elems[3] = 0;
  local_588.m_backend.data._M_elems[4] = 0;
  local_588.m_backend.data._M_elems[5] = 0;
  local_588.m_backend.data._M_elems[6] = 0;
  local_588.m_backend.data._M_elems[7] = 0;
  local_588.m_backend.data._M_elems[8] = 0;
  local_588.m_backend.data._M_elems[9] = 0;
  local_588.m_backend.data._M_elems[10] = 0;
  local_588.m_backend.data._M_elems[0xb] = 0;
  local_588.m_backend.data._M_elems[0xc] = 0;
  local_588.m_backend.data._M_elems[0xd] = 0;
  local_588.m_backend.data._M_elems._56_5_ = 0;
  local_588.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_588.m_backend.exp = 0;
  local_588.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_588,0.0);
  local_5d8.m_backend.fpclass = cpp_dec_float_finite;
  local_5d8.m_backend.prec_elem = 0x10;
  local_5d8.m_backend.data._M_elems[0] = 0;
  local_5d8.m_backend.data._M_elems[1] = 0;
  local_5d8.m_backend.data._M_elems[2] = 0;
  local_5d8.m_backend.data._M_elems[3] = 0;
  local_5d8.m_backend.data._M_elems[4] = 0;
  local_5d8.m_backend.data._M_elems[5] = 0;
  local_5d8.m_backend.data._M_elems[6] = 0;
  local_5d8.m_backend.data._M_elems[7] = 0;
  local_5d8.m_backend.data._M_elems[8] = 0;
  local_5d8.m_backend.data._M_elems[9] = 0;
  local_5d8.m_backend.data._M_elems[10] = 0;
  local_5d8.m_backend.data._M_elems[0xb] = 0;
  local_5d8.m_backend.data._M_elems[0xc] = 0;
  local_5d8.m_backend.data._M_elems[0xd] = 0;
  local_5d8.m_backend.data._M_elems._56_5_ = 0;
  local_5d8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_5d8.m_backend.exp = 0;
  local_5d8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_5d8,0.0);
  local_628.m_backend.fpclass = cpp_dec_float_finite;
  local_628.m_backend.prec_elem = 0x10;
  local_628.m_backend.data._M_elems[0] = 0;
  local_628.m_backend.data._M_elems[1] = 0;
  local_628.m_backend.data._M_elems[2] = 0;
  local_628.m_backend.data._M_elems[3] = 0;
  local_628.m_backend.data._M_elems[4] = 0;
  local_628.m_backend.data._M_elems[5] = 0;
  local_628.m_backend.data._M_elems[6] = 0;
  local_628.m_backend.data._M_elems[7] = 0;
  local_628.m_backend.data._M_elems[8] = 0;
  local_628.m_backend.data._M_elems[9] = 0;
  local_628.m_backend.data._M_elems[10] = 0;
  local_628.m_backend.data._M_elems[0xb] = 0;
  local_628.m_backend.data._M_elems[0xc] = 0;
  local_628.m_backend.data._M_elems[0xd] = 0;
  local_628.m_backend.data._M_elems._56_5_ = 0;
  local_628.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_628.m_backend.exp = 0;
  local_628.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_628,0.0);
  local_d8.m_backend.fpclass = cpp_dec_float_finite;
  local_d8.m_backend.prec_elem = 0x10;
  local_d8.m_backend.data._M_elems[0] = 0;
  local_d8.m_backend.data._M_elems[1] = 0;
  local_d8.m_backend.data._M_elems[2] = 0;
  local_d8.m_backend.data._M_elems[3] = 0;
  local_d8.m_backend.data._M_elems[4] = 0;
  local_d8.m_backend.data._M_elems[5] = 0;
  local_d8.m_backend.data._M_elems[6] = 0;
  local_d8.m_backend.data._M_elems[7] = 0;
  local_d8.m_backend.data._M_elems[8] = 0;
  local_d8.m_backend.data._M_elems[9] = 0;
  local_d8.m_backend.data._M_elems[10] = 0;
  local_d8.m_backend.data._M_elems[0xb] = 0;
  local_d8.m_backend.data._M_elems[0xc] = 0;
  local_d8.m_backend.data._M_elems[0xd] = 0;
  local_d8.m_backend.data._M_elems._56_5_ = 0;
  local_d8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_d8.m_backend.exp = 0;
  local_d8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,0.0);
  local_128.m_backend.fpclass = cpp_dec_float_finite;
  local_128.m_backend.prec_elem = 0x10;
  local_128.m_backend.data._M_elems[0] = 0;
  local_128.m_backend.data._M_elems[1] = 0;
  local_128.m_backend.data._M_elems[2] = 0;
  local_128.m_backend.data._M_elems[3] = 0;
  local_128.m_backend.data._M_elems[4] = 0;
  local_128.m_backend.data._M_elems[5] = 0;
  local_128.m_backend.data._M_elems[6] = 0;
  local_128.m_backend.data._M_elems[7] = 0;
  local_128.m_backend.data._M_elems[8] = 0;
  local_128.m_backend.data._M_elems[9] = 0;
  local_128.m_backend.data._M_elems[10] = 0;
  local_128.m_backend.data._M_elems[0xb] = 0;
  local_128.m_backend.data._M_elems[0xc] = 0;
  local_128.m_backend.data._M_elems[0xd] = 0;
  local_128.m_backend.data._M_elems._56_5_ = 0;
  local_128.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_128.m_backend.exp = 0;
  local_128.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,0.0);
  local_178.m_backend.fpclass = cpp_dec_float_finite;
  local_178.m_backend.prec_elem = 0x10;
  local_178.m_backend.data._M_elems[0] = 0;
  local_178.m_backend.data._M_elems[1] = 0;
  local_178.m_backend.data._M_elems[2] = 0;
  local_178.m_backend.data._M_elems[3] = 0;
  local_178.m_backend.data._M_elems[4] = 0;
  local_178.m_backend.data._M_elems[5] = 0;
  local_178.m_backend.data._M_elems[6] = 0;
  local_178.m_backend.data._M_elems[7] = 0;
  local_178.m_backend.data._M_elems[8] = 0;
  local_178.m_backend.data._M_elems[9] = 0;
  local_178.m_backend.data._M_elems[10] = 0;
  local_178.m_backend.data._M_elems[0xb] = 0;
  local_178.m_backend.data._M_elems[0xc] = 0;
  local_178.m_backend.data._M_elems[0xd] = 0;
  local_178.m_backend.data._M_elems._56_5_ = 0;
  local_178.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_178.m_backend.exp = 0;
  local_178.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_178,0.0);
  local_1c8.m_backend.fpclass = cpp_dec_float_finite;
  local_1c8.m_backend.prec_elem = 0x10;
  local_1c8.m_backend.data._M_elems[0] = 0;
  local_1c8.m_backend.data._M_elems[1] = 0;
  local_1c8.m_backend.data._M_elems[2] = 0;
  local_1c8.m_backend.data._M_elems[3] = 0;
  local_1c8.m_backend.data._M_elems[4] = 0;
  local_1c8.m_backend.data._M_elems[5] = 0;
  local_1c8.m_backend.data._M_elems[6] = 0;
  local_1c8.m_backend.data._M_elems[7] = 0;
  local_1c8.m_backend.data._M_elems[8] = 0;
  local_1c8.m_backend.data._M_elems[9] = 0;
  local_1c8.m_backend.data._M_elems[10] = 0;
  local_1c8.m_backend.data._M_elems[0xb] = 0;
  local_1c8.m_backend.data._M_elems[0xc] = 0;
  local_1c8.m_backend.data._M_elems[0xd] = 0;
  local_1c8.m_backend.data._M_elems._56_5_ = 0;
  local_1c8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_1c8.m_backend.exp = 0;
  local_1c8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_1c8,0.0);
  local_788.fpclass = cpp_dec_float_finite;
  local_788.prec_elem = 0x10;
  local_788.data._M_elems[0] = 0;
  local_788.data._M_elems[1] = 0;
  local_788.data._M_elems[2] = 0;
  local_788.data._M_elems[3] = 0;
  local_788.data._M_elems[4] = 0;
  local_788.data._M_elems[5] = 0;
  local_788.data._M_elems[6] = 0;
  local_788.data._M_elems[7] = 0;
  local_788.data._M_elems[8] = 0;
  local_788.data._M_elems[9] = 0;
  local_788.data._M_elems[10] = 0;
  local_788.data._M_elems[0xb] = 0;
  local_788.data._M_elems[0xc] = 0;
  local_788.data._M_elems[0xd] = 0;
  local_788.data._M_elems._56_5_ = 0;
  local_788.data._M_elems[0xf]._1_3_ = 0;
  local_788.exp = 0;
  local_788.neg = false;
  poVar14 = (soplex->spxout).m_streams[3];
  psVar1 = &this->validatesolution;
  iVar11 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar11 == 0) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_788,
               soplex->_currentSettings->_realParamValues[6]);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar11 == 0) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_788,
                 -soplex->_currentSettings->_realParamValues[6]);
    }
    else {
      dVar16 = atof((psVar1->_M_dataplus)._M_p);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_788,dVar16);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_6e8,soplex);
  local_218.data._M_elems._56_5_ = local_788.data._M_elems._56_5_;
  local_218.data._M_elems[0xf]._1_3_ = local_788.data._M_elems[0xf]._1_3_;
  local_218.data._M_elems[0] = local_788.data._M_elems[0];
  local_218.data._M_elems[1] = local_788.data._M_elems[1];
  local_218.data._M_elems[2] = local_788.data._M_elems[2];
  local_218.data._M_elems[3] = local_788.data._M_elems[3];
  local_218.data._M_elems[4] = local_788.data._M_elems[4];
  local_218.data._M_elems[5] = local_788.data._M_elems[5];
  local_218.data._M_elems[6] = local_788.data._M_elems[6];
  local_218.data._M_elems[7] = local_788.data._M_elems[7];
  local_218.data._M_elems[8] = local_788.data._M_elems[8];
  local_218.data._M_elems[9] = local_788.data._M_elems[9];
  local_218.data._M_elems[10] = local_788.data._M_elems[10];
  local_218.data._M_elems[0xb] = local_788.data._M_elems[0xb];
  local_218.data._M_elems[0xc] = local_788.data._M_elems[0xc];
  local_218.data._M_elems[0xd] = local_788.data._M_elems[0xd];
  local_218.exp = local_788.exp;
  local_218.neg = local_788.neg;
  local_218.fpclass = local_788.fpclass;
  local_218.prec_elem = local_788.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
            (&local_218,(cpp_dec_float<100U,_int,_void> *)local_6e8);
  local_738.m_backend.neg = local_218.neg;
  if (local_218.neg == true) {
    local_738.m_backend.neg =
         local_218.fpclass == cpp_dec_float_finite && local_218.data._M_elems[0] == 0;
  }
  local_738.m_backend.data._M_elems[0] = local_218.data._M_elems[0];
  local_738.m_backend.data._M_elems[1] = local_218.data._M_elems[1];
  local_738.m_backend.data._M_elems[2] = local_218.data._M_elems[2];
  local_738.m_backend.data._M_elems[3] = local_218.data._M_elems[3];
  local_738.m_backend.data._M_elems[4] = local_218.data._M_elems[4];
  local_738.m_backend.data._M_elems[5] = local_218.data._M_elems[5];
  local_738.m_backend.data._M_elems[6] = local_218.data._M_elems[6];
  local_738.m_backend.data._M_elems[7] = local_218.data._M_elems[7];
  local_738.m_backend.data._M_elems[8] = local_218.data._M_elems[8];
  local_738.m_backend.data._M_elems[9] = local_218.data._M_elems[9];
  local_738.m_backend.data._M_elems[10] = local_218.data._M_elems[10];
  local_738.m_backend.data._M_elems[0xb] = local_218.data._M_elems[0xb];
  local_738.m_backend.data._M_elems[0xc] = local_218.data._M_elems[0xc];
  local_738.m_backend.data._M_elems[0xd] = local_218.data._M_elems[0xd];
  local_738.m_backend.data._M_elems._56_5_ = local_218.data._M_elems._56_5_;
  local_738.m_backend.data._M_elems[0xf]._1_3_ = local_218.data._M_elems[0xf]._1_3_;
  local_738.m_backend.exp = local_218.exp;
  local_738.m_backend.fpclass = local_218.fpclass;
  local_738.m_backend.prec_elem = local_218.prec_elem;
  if (soplex->_status != INForUNBD) goto LAB_00372986;
  if ((local_788.fpclass == cpp_dec_float_NaN) ||
     (dVar16 = soplex->_currentSettings->_realParamValues[6], NAN(dVar16))) {
LAB_00372913:
    if ((local_788.fpclass == cpp_dec_float_NaN) ||
       (dVar16 = soplex->_currentSettings->_realParamValues[6], NAN(dVar16))) goto LAB_00372986;
    local_6a0._0_4_ = cpp_dec_float_finite;
    local_6a0._4_4_ = 0x10;
    local_6e8._0_8_ = (char **)0x0;
    local_6e8._8_8_ = 0;
    local_6d8 = (char *)0x0;
    lStack_6d0 = 0;
    local_6c8[0] = 0;
    local_6c8[1] = 0;
    local_6c8[2] = 0;
    local_6c8[3] = 0;
    local_6c8[4] = 0;
    local_6c8[5] = 0;
    stack0xfffffffffffff950 = 0;
    uStack_6ab = 0;
    uStack_6a8._0_4_ = 0;
    uStack_6a8._4_1_ = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_6e8,-dVar16);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_788,(cpp_dec_float<100U,_int,_void> *)local_6e8);
    if (iVar11 != 0) goto LAB_00372986;
  }
  else {
    local_6a0._0_4_ = cpp_dec_float_finite;
    local_6a0._4_4_ = 0x10;
    local_6e8._0_8_ = (char **)0x0;
    local_6e8._8_8_ = 0;
    local_6d8 = (char *)0x0;
    lStack_6d0 = 0;
    local_6c8[0] = 0;
    local_6c8[1] = 0;
    local_6c8[2] = 0;
    local_6c8[3] = 0;
    local_6c8[4] = 0;
    local_6c8[5] = 0;
    stack0xfffffffffffff950 = 0;
    uStack_6ab = 0;
    uStack_6a8._0_4_ = 0;
    uStack_6a8._4_1_ = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_6e8,dVar16);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_788,(cpp_dec_float<100U,_int,_void> *)local_6e8);
    if (iVar11 != 0) goto LAB_00372913;
  }
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_738,0.0);
LAB_00372986:
  local_678.m_backend.data._M_elems[2] = local_738.m_backend.data._M_elems[2];
  local_678.m_backend.data._M_elems[1] = local_738.m_backend.data._M_elems[1];
  local_678.m_backend.data._M_elems[5] = local_738.m_backend.data._M_elems[5];
  local_678.m_backend.data._M_elems[4] = local_738.m_backend.data._M_elems[4];
  local_678.m_backend.data._M_elems[7] = local_738.m_backend.data._M_elems[7];
  local_678.m_backend.data._M_elems[6] = local_738.m_backend.data._M_elems[6];
  local_678.m_backend.data._M_elems[9] = local_738.m_backend.data._M_elems[9];
  local_678.m_backend.data._M_elems[8] = local_738.m_backend.data._M_elems[8];
  local_678.m_backend.data._M_elems[0xb] = local_738.m_backend.data._M_elems[0xb];
  local_678.m_backend.data._M_elems[10] = local_738.m_backend.data._M_elems[10];
  local_678.m_backend.data._M_elems[0xd] = local_738.m_backend.data._M_elems[0xd];
  local_678.m_backend.data._M_elems[0xc] = local_738.m_backend.data._M_elems[0xc];
  local_678.m_backend.data._M_elems[0xf]._1_3_ = local_738.m_backend.data._M_elems[0xf]._1_3_;
  local_678.m_backend.data._M_elems._56_5_ = local_738.m_backend.data._M_elems._56_5_;
  local_678.m_backend.data._M_elems[0] = local_738.m_backend.data._M_elems[0];
  local_678.m_backend.data._M_elems[3] = local_738.m_backend.data._M_elems[3];
  local_678.m_backend.exp = local_738.m_backend.exp;
  local_678.m_backend.neg = local_738.m_backend.neg;
  local_678.m_backend.fpclass = local_738.m_backend.fpclass;
  local_678.m_backend.prec_elem = local_738.m_backend.prec_elem;
  local_268.m_backend.fpclass = cpp_dec_float_finite;
  local_268.m_backend.data._M_elems[0] = 0;
  local_268.m_backend.data._M_elems[1] = 0;
  local_268.m_backend.data._M_elems[2] = 0;
  local_268.m_backend.data._M_elems[3] = 0;
  local_268.m_backend.data._M_elems[4] = 0;
  local_268.m_backend.data._M_elems[5] = 0;
  local_268.m_backend.data._M_elems[6] = 0;
  local_268.m_backend.data._M_elems[7] = 0;
  local_268.m_backend.data._M_elems[8] = 0;
  local_268.m_backend.data._M_elems[9] = 0;
  local_268.m_backend.data._M_elems[10] = 0;
  local_268.m_backend.data._M_elems[0xb] = 0;
  local_268.m_backend.data._M_elems[0xc] = 0;
  local_268.m_backend.data._M_elems[0xd] = 0;
  local_268.m_backend.data._M_elems._56_5_ = 0;
  local_268.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_268.m_backend.exp = 0;
  local_268.m_backend.neg = false;
  local_268.m_backend.prec_elem = 0x10;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_268,0.0);
  local_88.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)(this->validatetolerance).m_backend.data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
  local_88.m_backend.exp = (this->validatetolerance).m_backend.exp;
  local_88.m_backend.neg = (this->validatetolerance).m_backend.neg;
  local_88.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
  local_88.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
  bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_678,&local_268,&local_88);
  if (!bVar7) {
    std::__cxx11::string::append((char *)&local_7a8);
  }
  bVar7 = bVar7;
  if (soplex->_status == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(soplex,&local_538,&local_d8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(soplex,&local_588,&local_128);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation(soplex,&local_5d8,&local_178);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(soplex,&local_628,&local_1c8);
    pnVar2 = &this->validatetolerance;
    local_2b8.m_backend.data._M_elems[0xf]._1_3_ = local_538.m_backend.data._M_elems[0xf]._1_3_;
    local_2b8.m_backend.data._M_elems._56_5_ = local_538.m_backend.data._M_elems._56_5_;
    local_2b8.m_backend.data._M_elems[0xc] = local_538.m_backend.data._M_elems[0xc];
    local_2b8.m_backend.data._M_elems[0xd] = local_538.m_backend.data._M_elems[0xd];
    local_2b8.m_backend.data._M_elems[8] = local_538.m_backend.data._M_elems[8];
    local_2b8.m_backend.data._M_elems[9] = local_538.m_backend.data._M_elems[9];
    local_2b8.m_backend.data._M_elems[10] = local_538.m_backend.data._M_elems[10];
    local_2b8.m_backend.data._M_elems[0xb] = local_538.m_backend.data._M_elems[0xb];
    local_2b8.m_backend.data._M_elems[4] = local_538.m_backend.data._M_elems[4];
    local_2b8.m_backend.data._M_elems[5] = local_538.m_backend.data._M_elems[5];
    local_2b8.m_backend.data._M_elems[6] = local_538.m_backend.data._M_elems[6];
    local_2b8.m_backend.data._M_elems[7] = local_538.m_backend.data._M_elems[7];
    local_2b8.m_backend.data._M_elems[0] = local_538.m_backend.data._M_elems[0];
    local_2b8.m_backend.data._M_elems[1] = local_538.m_backend.data._M_elems[1];
    local_2b8.m_backend.data._M_elems[2] = local_538.m_backend.data._M_elems[2];
    local_2b8.m_backend.data._M_elems[3] = local_538.m_backend.data._M_elems[3];
    local_2b8.m_backend.exp = local_538.m_backend.exp;
    local_2b8.m_backend.neg = local_538.m_backend.neg;
    local_2b8.m_backend.fpclass = local_538.m_backend.fpclass;
    local_2b8.m_backend.prec_elem = local_538.m_backend.prec_elem;
    local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_308.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_308.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_308.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_308.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_308.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_308.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_308.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_308.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_308.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_308.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_308.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_2b8,&local_308,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_7a8);
    }
    local_358.m_backend.data._M_elems[0xf]._1_3_ = local_588.m_backend.data._M_elems[0xf]._1_3_;
    local_358.m_backend.data._M_elems._56_5_ = local_588.m_backend.data._M_elems._56_5_;
    local_358.m_backend.data._M_elems[0xc] = local_588.m_backend.data._M_elems[0xc];
    local_358.m_backend.data._M_elems[0xd] = local_588.m_backend.data._M_elems[0xd];
    local_358.m_backend.data._M_elems[8] = local_588.m_backend.data._M_elems[8];
    local_358.m_backend.data._M_elems[9] = local_588.m_backend.data._M_elems[9];
    local_358.m_backend.data._M_elems[10] = local_588.m_backend.data._M_elems[10];
    local_358.m_backend.data._M_elems[0xb] = local_588.m_backend.data._M_elems[0xb];
    local_358.m_backend.data._M_elems[4] = local_588.m_backend.data._M_elems[4];
    local_358.m_backend.data._M_elems[5] = local_588.m_backend.data._M_elems[5];
    local_358.m_backend.data._M_elems[6] = local_588.m_backend.data._M_elems[6];
    local_358.m_backend.data._M_elems[7] = local_588.m_backend.data._M_elems[7];
    local_358.m_backend.data._M_elems[0] = local_588.m_backend.data._M_elems[0];
    local_358.m_backend.data._M_elems[1] = local_588.m_backend.data._M_elems[1];
    local_358.m_backend.data._M_elems[2] = local_588.m_backend.data._M_elems[2];
    local_358.m_backend.data._M_elems[3] = local_588.m_backend.data._M_elems[3];
    local_358.m_backend.exp = local_588.m_backend.exp;
    local_358.m_backend.neg = local_588.m_backend.neg;
    local_358.m_backend.fpclass = local_588.m_backend.fpclass;
    local_358.m_backend.prec_elem = local_588.m_backend.prec_elem;
    local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_3a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_3a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_3a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_3a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_3a8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_3a8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_3a8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_3a8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_3a8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_3a8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_3a8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar9 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_358,&local_3a8,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar9) {
      std::__cxx11::string::append((char *)&local_7a8);
    }
    local_3f8.m_backend.data._M_elems[0xf]._1_3_ = local_5d8.m_backend.data._M_elems[0xf]._1_3_;
    local_3f8.m_backend.data._M_elems._56_5_ = local_5d8.m_backend.data._M_elems._56_5_;
    local_3f8.m_backend.data._M_elems[0xc] = local_5d8.m_backend.data._M_elems[0xc];
    local_3f8.m_backend.data._M_elems[0xd] = local_5d8.m_backend.data._M_elems[0xd];
    local_3f8.m_backend.data._M_elems[8] = local_5d8.m_backend.data._M_elems[8];
    local_3f8.m_backend.data._M_elems[9] = local_5d8.m_backend.data._M_elems[9];
    local_3f8.m_backend.data._M_elems[10] = local_5d8.m_backend.data._M_elems[10];
    local_3f8.m_backend.data._M_elems[0xb] = local_5d8.m_backend.data._M_elems[0xb];
    local_3f8.m_backend.data._M_elems[4] = local_5d8.m_backend.data._M_elems[4];
    local_3f8.m_backend.data._M_elems[5] = local_5d8.m_backend.data._M_elems[5];
    local_3f8.m_backend.data._M_elems[6] = local_5d8.m_backend.data._M_elems[6];
    local_3f8.m_backend.data._M_elems[7] = local_5d8.m_backend.data._M_elems[7];
    local_3f8.m_backend.data._M_elems[0] = local_5d8.m_backend.data._M_elems[0];
    local_3f8.m_backend.data._M_elems[1] = local_5d8.m_backend.data._M_elems[1];
    local_3f8.m_backend.data._M_elems[2] = local_5d8.m_backend.data._M_elems[2];
    local_3f8.m_backend.data._M_elems[3] = local_5d8.m_backend.data._M_elems[3];
    local_3f8.m_backend.exp = local_5d8.m_backend.exp;
    local_3f8.m_backend.neg = local_5d8.m_backend.neg;
    local_3f8.m_backend.fpclass = local_5d8.m_backend.fpclass;
    local_3f8.m_backend.prec_elem = local_5d8.m_backend.prec_elem;
    local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_448.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_448.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_448.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_448.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_448.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_448.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_448.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_448.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_448.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_448.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_448.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar10 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_3f8,&local_448,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar10) {
      std::__cxx11::string::append((char *)&local_7a8);
    }
    bVar7 = bVar10 && (bVar9 && (bVar8 && bVar7));
    local_498.m_backend.data._M_elems[0xf]._1_3_ = local_628.m_backend.data._M_elems[0xf]._1_3_;
    local_498.m_backend.data._M_elems._56_5_ = local_628.m_backend.data._M_elems._56_5_;
    local_498.m_backend.data._M_elems[0xc] = local_628.m_backend.data._M_elems[0xc];
    local_498.m_backend.data._M_elems[0xd] = local_628.m_backend.data._M_elems[0xd];
    local_498.m_backend.data._M_elems[8] = local_628.m_backend.data._M_elems[8];
    local_498.m_backend.data._M_elems[9] = local_628.m_backend.data._M_elems[9];
    local_498.m_backend.data._M_elems[10] = local_628.m_backend.data._M_elems[10];
    local_498.m_backend.data._M_elems[0xb] = local_628.m_backend.data._M_elems[0xb];
    local_498.m_backend.data._M_elems[4] = local_628.m_backend.data._M_elems[4];
    local_498.m_backend.data._M_elems[5] = local_628.m_backend.data._M_elems[5];
    local_498.m_backend.data._M_elems[6] = local_628.m_backend.data._M_elems[6];
    local_498.m_backend.data._M_elems[7] = local_628.m_backend.data._M_elems[7];
    local_498.m_backend.data._M_elems[0] = local_628.m_backend.data._M_elems[0];
    local_498.m_backend.data._M_elems[1] = local_628.m_backend.data._M_elems[1];
    local_498.m_backend.data._M_elems[2] = local_628.m_backend.data._M_elems[2];
    local_498.m_backend.data._M_elems[3] = local_628.m_backend.data._M_elems[3];
    local_498.m_backend.exp = local_628.m_backend.exp;
    local_498.m_backend.neg = local_628.m_backend.neg;
    local_498.m_backend.fpclass = local_628.m_backend.fpclass;
    local_498.m_backend.prec_elem = local_628.m_backend.prec_elem;
    local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
    local_4e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_4e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_4e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_4e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_4e8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_4e8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_4e8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_4e8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_4e8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_4e8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_4e8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    pTVar3 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar17 = Tolerances::epsilon(pTVar3);
    bVar8 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_498,&local_4e8,RVar17);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (!bVar8) {
      std::__cxx11::string::append((char *)&local_7a8);
      bVar7 = false;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Validation          :",0x15);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," Success\n",9);
  }
  else {
    local_7a8._M_dataplus._M_p[local_7a8._M_string_length - 2] = ']';
    std::operator+(&local_698," Fail [",&local_7a8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_698);
    ppcVar15 = (char **)(plVar12 + 2);
    if ((char **)*plVar12 == ppcVar15) {
      local_6d8 = *ppcVar15;
      lStack_6d0 = plVar12[3];
      local_6e8._0_8_ = &local_6d8;
    }
    else {
      local_6d8 = *ppcVar15;
      local_6e8._0_8_ = (char **)*plVar12;
    }
    local_6e8._8_8_ = plVar12[1];
    *plVar12 = (long)ppcVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,(char *)local_6e8._0_8_,local_6e8._8_8_);
    if ((char **)local_6e8._0_8_ != &local_6d8) {
      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6d8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Objective        : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_738);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Bound            : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_538);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Row              : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_588);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Reduced Cost     : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar13 = boost::multiprecision::operator<<(poVar14,&local_5d8);
  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   Dual             : ",0x16);
  lVar5 = *(long *)poVar14;
  lVar6 = *(long *)(lVar5 + -0x18);
  *(uint *)(poVar14 + lVar6 + 0x18) = *(uint *)(poVar14 + lVar6 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar14 + *(long *)(lVar5 + -0x18) + 8) = 8;
  poVar14 = boost::multiprecision::operator<<(poVar14,&local_628);
  *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
       *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}